

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

int poll(pollfd *__fds,nfds_t __nfds,int __timeout)

{
  bool bVar1;
  int iVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  stCoEpoll_t *psVar5;
  nfds_t nVar6;
  nfds_t nfds;
  pollfd *__k;
  pollfd *local_70;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> m;
  
  if (g_sys_poll_func == (poll_pfn_t)0x0) {
    g_sys_poll_func = (poll_pfn_t)dlsym(0xffffffffffffffff,"poll");
  }
  bVar1 = co_is_enable_sys_hook();
  if (__timeout != 0 && bVar1) {
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &m._M_t._M_impl.super__Rb_tree_header._M_header;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    nfds = 0;
    local_70 = (pollfd *)0x0;
    m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (1 < __nfds) {
      local_70 = (pollfd *)malloc(__nfds * 8);
      nfds = 0;
      nVar6 = __nfds;
      __k = __fds;
      while (bVar1 = nVar6 != 0, nVar6 = nVar6 - 1, bVar1) {
        iVar3 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find(&m._M_t,&__k->fd);
        if ((_Rb_tree_header *)iVar3._M_node == &m._M_t._M_impl.super__Rb_tree_header) {
          *(pollfd *)(local_70 + nfds) = *__k;
          pmVar4 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&m._M_t,&__k->fd);
          *pmVar4 = (mapped_type)nfds;
          nfds = nfds + 1;
        }
        else {
          local_70[*(int *)&iVar3._M_node[1].field_0x4].events =
               local_70[*(int *)&iVar3._M_node[1].field_0x4].events | __k->events;
        }
        __k = __k + 1;
      }
    }
    if (__nfds == 1 || nfds == __nfds) {
      psVar5 = co_get_epoll_ct();
      iVar2 = co_poll_inner(psVar5,(pollfd *)__fds,__nfds,__timeout,g_sys_poll_func);
    }
    else {
      psVar5 = co_get_epoll_ct();
      iVar2 = co_poll_inner(psVar5,local_70,nfds,__timeout,g_sys_poll_func);
      if (0 < iVar2) {
        while (bVar1 = __nfds != 0, __nfds = __nfds - 1, bVar1) {
          iVar3 = std::
                  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  ::find(&m._M_t,&__fds->fd);
          if ((_Rb_tree_header *)iVar3._M_node != &m._M_t._M_impl.super__Rb_tree_header) {
            __fds->revents = __fds->events & local_70[*(int *)&iVar3._M_node[1].field_0x4].revents;
          }
          __fds = __fds + 1;
        }
      }
    }
    free(local_70);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&m._M_t);
    return iVar2;
  }
  iVar2 = (*g_sys_poll_func)((pollfd *)__fds,__nfds,__timeout);
  return iVar2;
}

Assistant:

int poll(struct pollfd fds[], nfds_t nfds, int timeout)
{
	HOOK_SYS_FUNC( poll );

	if (!co_is_enable_sys_hook() || timeout == 0) {
		return g_sys_poll_func(fds, nfds, timeout);
	}
	pollfd *fds_merge = NULL;
	nfds_t nfds_merge = 0;
	std::map<int, int> m;  // fd --> idx
	std::map<int, int>::iterator it;
	if (nfds > 1) {
		fds_merge = (pollfd *)malloc(sizeof(pollfd) * nfds);
		for (size_t i = 0; i < nfds; i++) {
			if ((it = m.find(fds[i].fd)) == m.end()) {
				fds_merge[nfds_merge] = fds[i];
				m[fds[i].fd] = nfds_merge;
				nfds_merge++;
			} else {
				int j = it->second;
				fds_merge[j].events |= fds[i].events;  // merge in j slot
			}
		}
	}

	int ret = 0;
	if (nfds_merge == nfds || nfds == 1) {
		ret = co_poll_inner(co_get_epoll_ct(), fds, nfds, timeout, g_sys_poll_func);
	} else {
		ret = co_poll_inner(co_get_epoll_ct(), fds_merge, nfds_merge, timeout,
				g_sys_poll_func);
		if (ret > 0) {
			for (size_t i = 0; i < nfds; i++) {
				it = m.find(fds[i].fd);
				if (it != m.end()) {
					int j = it->second;
					fds[i].revents = fds_merge[j].revents & fds[i].events;
				}
			}
		}
	}
	free(fds_merge);
	return ret;


}